

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::getaddressinfo(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffdce8;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  allocator<RPCResult> *paVar3;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffdcf0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffdcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdd20;
  allocator<char> *in_stack_ffffffffffffdd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdd30;
  undefined7 in_stack_ffffffffffffdd38;
  undefined1 in_stack_ffffffffffffdd3f;
  string *in_stack_ffffffffffffdd40;
  undefined7 in_stack_ffffffffffffdd48;
  undefined1 in_stack_ffffffffffffdd4f;
  undefined4 in_stack_ffffffffffffdd50;
  Type in_stack_ffffffffffffdd54;
  string *in_stack_ffffffffffffdd58;
  undefined4 in_stack_ffffffffffffdd60;
  Type in_stack_ffffffffffffdd64;
  undefined4 in_stack_ffffffffffffdd68;
  Type in_stack_ffffffffffffdd6c;
  RPCResult *in_stack_ffffffffffffdd70;
  undefined1 *local_2230;
  undefined1 *local_2218;
  undefined1 *local_2200;
  undefined1 *local_21e8;
  RPCExamples *in_stack_ffffffffffffde30;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_1d70 [36];
  undefined1 local_1d4c;
  undefined1 local_1d4b [2];
  undefined1 local_1d49 [32];
  allocator<char> local_1d29 [31];
  allocator<char> local_1d0a;
  allocator<char> local_1d09 [31];
  allocator<char> local_1cea;
  allocator<char> local_1ce9 [17];
  undefined8 local_1cd8;
  allocator<char> local_1cca;
  allocator<char> local_1cc9;
  size_type local_1cc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1cc0;
  allocator<char> local_1caa;
  allocator<char> local_1ca9 [9];
  size_type sStack_1ca0;
  undefined1 local_1c98 [16];
  pointer local_1c88;
  pointer pbStack_1c80;
  pointer local_1c78;
  allocator<char> local_1c6b;
  allocator<char> local_1c6a [2];
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  allocator<char> local_1c4a;
  allocator<char> local_1c49 [31];
  allocator<char> local_1c2a;
  allocator<char> local_1c29;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  allocator<char> local_1c0a;
  allocator<char> local_1c09;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  allocator<char> local_1beb;
  allocator<char> local_1bea [2];
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  allocator<char> local_1bca;
  allocator<char> local_1bc9 [31];
  allocator<char> local_1baa;
  allocator<char> local_1ba9;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  allocator<char> local_1b8a;
  allocator<char> local_1b89;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  allocator<char> local_1b6a;
  allocator<char> local_1b69;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  allocator<char> local_1b4a;
  allocator<char> local_1b49;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  allocator<char> local_1b2a;
  allocator<char> local_1b29;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  allocator<char> local_1b0a;
  allocator<char> local_1b09;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  allocator<char> local_1aea;
  allocator<char> local_1ae9;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  allocator<char> local_1aca;
  allocator<char> local_1ac9;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  allocator<char> local_1aaa;
  allocator<char> local_1aa9;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  allocator<char> local_1a8a;
  allocator<char> local_1a89;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  allocator<char> local_1a6a;
  allocator<char> local_1a69;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  allocator<char> local_1a4a;
  allocator<char> local_1a49;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  allocator<char> local_1a2a;
  allocator<char> local_1a29;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  allocator<char> local_1a0a;
  allocator<char> local_1a09;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  allocator<char> local_19e2;
  allocator<char> local_19e1 [31];
  allocator<char> local_19c2;
  allocator<char> local_19c1 [32];
  allocator<char> local_19a1;
  undefined4 local_19a0;
  allocator<char> local_1999 [31];
  allocator<char> local_197a;
  allocator<char> local_1979 [385];
  undefined1 local_17f8 [136];
  undefined1 local_1770 [480];
  undefined1 local_1590 [136];
  undefined1 local_1508 [256];
  undefined1 local_1408 [136];
  undefined1 local_1380 [896];
  undefined8 local_1000;
  undefined1 local_fc0 [2312];
  RPCMethodImpl local_6b8 [29];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_19a0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdcf8,(Optional *)in_stack_ffffffffffffdcf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdd00);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdce8);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
                 in_stack_ffffffffffffdd58,in_stack_ffffffffffffdd54,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
                 in_stack_ffffffffffffdd40,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffdce8);
  __l._M_len._0_7_ = in_stack_ffffffffffffdd38;
  __l._M_array = (iterator)in_stack_ffffffffffffdd30;
  __l._M_len._7_1_ = in_stack_ffffffffffffdd3f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdd28,__l,
             (allocator_type *)in_stack_ffffffffffffdd20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1a08 = 0;
  uStack_1a00 = 0;
  local_19f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdce8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1a28 = 0;
  uStack_1a20 = 0;
  local_1a18 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdce8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1a48 = 0;
  uStack_1a40 = 0;
  local_1a38 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdce8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1a68 = 0;
  uStack_1a60 = 0;
  local_1a58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdce8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1a88 = 0;
  uStack_1a80 = 0;
  local_1a78 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdce8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1aa8 = 0;
  uStack_1aa0 = 0;
  local_1a98 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdce8);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffdce8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1ac8 = 0;
  uStack_1ac0 = 0;
  local_1ab8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1ae8 = 0;
  uStack_1ae0 = 0;
  local_1ad8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1b08 = 0;
  uStack_1b00 = 0;
  local_1af8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1b28 = 0;
  uStack_1b20 = 0;
  local_1b18 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1b48 = 0;
  uStack_1b40 = 0;
  local_1b38 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1b68 = 0;
  uStack_1b60 = 0;
  local_1b58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1b88 = 0;
  uStack_1b80 = 0;
  local_1b78 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1ba8 = 0;
  uStack_1ba0 = 0;
  local_1b98 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1be8 = 0;
  uStack_1be0 = 0;
  local_1bd8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffdd38;
  __l_00._M_array = (iterator)in_stack_ffffffffffffdd30;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffdd3f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd28,__l_00,
             (allocator_type *)in_stack_ffffffffffffdd20);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1c08 = 0;
  uStack_1c00 = 0;
  local_1bf8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1c28 = 0;
  uStack_1c20 = 0;
  local_1c18 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  fun = local_6b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1c68 = 0;
  uStack_1c60 = 0;
  local_1c58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffdd38;
  __l_01._M_array = (iterator)in_stack_ffffffffffffdd30;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffdd3f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd28,__l_01,
             (allocator_type *)in_stack_ffffffffffffdd20);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1c88 = (pointer)0x0;
  pbStack_1c80 = (pointer)0x0;
  local_1c78 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
                 in_stack_ffffffffffffdd30);
  std::operator+(in_stack_ffffffffffffdd00,(char *)in_stack_ffffffffffffdcf8);
  local_1ca9[1] = (allocator<char>)0x0;
  local_1ca9[2] = (allocator<char>)0x0;
  local_1ca9[3] = (allocator<char>)0x0;
  local_1ca9[4] = (allocator<char>)0x0;
  local_1ca9[5] = (allocator<char>)0x0;
  local_1ca9[6] = (allocator<char>)0x0;
  local_1ca9[7] = (allocator<char>)0x0;
  local_1ca9[8] = (allocator<char>)0x0;
  sStack_1ca0 = 0;
  local_1c98._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1cc8 = 0;
  aStack_1cc0._M_allocated_capacity = 0;
  aStack_1cc0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1ce9._1_8_ = 0;
  local_1ce9._9_8_ = 0;
  local_1cd8._0_1_ = '\0';
  local_1cd8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1d09._1_8_ = 0;
  local_1d09._9_8_ = 0;
  local_1d09[0x11] = (allocator<char>)0x0;
  local_1d09[0x12] = (allocator<char>)0x0;
  local_1d09[0x13] = (allocator<char>)0x0;
  local_1d09[0x14] = (allocator<char>)0x0;
  local_1d09[0x15] = (allocator<char>)0x0;
  local_1d09[0x16] = (allocator<char>)0x0;
  local_1d09[0x17] = (allocator<char>)0x0;
  local_1d09[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd58,
             SUB41(in_stack_ffffffffffffdd54 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdd4f,in_stack_ffffffffffffdd48),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd40,
             (bool)in_stack_ffffffffffffdd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  local_1d49._1_8_ = (pointer)0x0;
  local_1d49._9_8_ = (pointer)0x0;
  local_1d49._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  this_00 = (RPCHelpMan *)local_1d49;
  std::allocator<RPCResult>::allocator(paVar3);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffdd38;
  __l_02._M_array = (iterator)in_stack_ffffffffffffdd30;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffdd3f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd28,__l_02,
             (allocator_type *)in_stack_ffffffffffffdd20);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  name = (string *)(local_1d4b + 1);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffdd38;
  __l_03._M_array = (iterator)in_stack_ffffffffffffdd30;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffdd3f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdd28,__l_03,
             (allocator_type *)in_stack_ffffffffffffdd20);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd6c,
             (string *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
             in_stack_ffffffffffffdd58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdd54,in_stack_ffffffffffffdd50),
             (bool)in_stack_ffffffffffffdd4f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60));
  description = (string *)local_1d4b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
                 in_stack_ffffffffffffdd30);
  std::operator+(in_stack_ffffffffffffdd00,(char *)in_stack_ffffffffffffdcf8);
  HelpExampleCli(in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_1d4c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
             (char *)in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffdd3f,in_stack_ffffffffffffdd38),
                 in_stack_ffffffffffffdd30);
  std::operator+(in_stack_ffffffffffffdd00,(char *)in_stack_ffffffffffffdcf8);
  HelpExampleRpc(in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18);
  std::operator+(in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0xbee22f);
  this = (RPCArg *)local_1d70;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::getaddressinfo()::__0,void>(in_stack_ffffffffffffdcf8,in_stack_ffffffffffffdcf0);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,(RPCResults *)this,in_stack_ffffffffffffde30,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d4c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1d4b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar1 = local_300;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != local_fc0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_21e8 = local_1770;
  do {
    local_21e8 = local_21e8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_21e8 != local_17f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1d49 + 0x1f));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1d29);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1d09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1ce9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cc9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1caa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1ca9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1c98 + 0xf));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c6b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c6a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2200 = local_1508;
  do {
    local_2200 = local_2200 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2200 != local_1590);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c49);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1beb);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1bea);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2218 = local_1380;
  do {
    local_2218 = local_2218 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2218 != local_1408);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1bc9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1baa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ba9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b8a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b6a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1aea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ae9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1aca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ac9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1aaa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1aa9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a8a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a6a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdcf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19e2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_19e1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19c2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_19c1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdcf8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_2230 = local_48;
  do {
    local_2230 = local_2230 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_2230 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19a1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1999);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_197a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1979);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getaddressinfo()
{
    return RPCHelpMan{"getaddressinfo",
                "\nReturn information about the given bitcoin address.\n"
                "Some of the information will only be present if the address is in the active wallet.\n",
                {
                    {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address for which to get information."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "address", "The bitcoin address validated."},
                        {RPCResult::Type::STR_HEX, "scriptPubKey", "The hex-encoded output script generated by the address."},
                        {RPCResult::Type::BOOL, "ismine", "If the address is yours."},
                        {RPCResult::Type::BOOL, "iswatchonly", "If the address is watchonly."},
                        {RPCResult::Type::BOOL, "solvable", "If we know how to spend coins sent to this address, ignoring the possible lack of private keys."},
                        {RPCResult::Type::STR, "desc", /*optional=*/true, "A descriptor for spending coins sent to this address (only when solvable)."},
                        {RPCResult::Type::STR, "parent_desc", /*optional=*/true, "The descriptor used to derive this address if this is a descriptor wallet"},
                        {RPCResult::Type::BOOL, "isscript", /*optional=*/true, "If the key is a script."},
                        {RPCResult::Type::BOOL, "ischange", "If the address was used for change output."},
                        {RPCResult::Type::BOOL, "iswitness", "If the address is a witness address."},
                        {RPCResult::Type::NUM, "witness_version", /*optional=*/true, "The version number of the witness program."},
                        {RPCResult::Type::STR_HEX, "witness_program", /*optional=*/true, "The hex value of the witness program."},
                        {RPCResult::Type::STR, "script", /*optional=*/true, "The output script type. Only if isscript is true and the redeemscript is known. Possible\n"
                                                                     "types: nonstandard, pubkey, pubkeyhash, scripthash, multisig, nulldata, witness_v0_keyhash,\n"
                            "witness_v0_scripthash, witness_unknown."},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The redeemscript for the p2sh address."},
                        {RPCResult::Type::ARR, "pubkeys", /*optional=*/true, "Array of pubkeys associated with the known redeemscript (only if script is multisig).",
                        {
                            {RPCResult::Type::STR, "pubkey", ""},
                        }},
                        {RPCResult::Type::NUM, "sigsrequired", /*optional=*/true, "The number of signatures required to spend multisig output (only if script is multisig)."},
                        {RPCResult::Type::STR_HEX, "pubkey", /*optional=*/true, "The hex value of the raw public key for single-key addresses (possibly embedded in P2SH or P2WSH)."},
                        {RPCResult::Type::OBJ, "embedded", /*optional=*/true, "Information about the address embedded in P2SH or P2WSH, if relevant and known.",
                        {
                            {RPCResult::Type::ELISION, "", "Includes all getaddressinfo output fields for the embedded address, excluding metadata (timestamp, hdkeypath, hdseedid)\n"
                            "and relation to the wallet (ismine, iswatchonly)."},
                        }},
                        {RPCResult::Type::BOOL, "iscompressed", /*optional=*/true, "If the pubkey is compressed."},
                        {RPCResult::Type::NUM_TIME, "timestamp", /*optional=*/true, "The creation time of the key, if available, expressed in " + UNIX_EPOCH_TIME + "."},
                        {RPCResult::Type::STR, "hdkeypath", /*optional=*/true, "The HD keypath, if the key is HD and available."},
                        {RPCResult::Type::STR_HEX, "hdseedid", /*optional=*/true, "The Hash160 of the HD seed."},
                        {RPCResult::Type::STR_HEX, "hdmasterfingerprint", /*optional=*/true, "The fingerprint of the master key."},
                        {RPCResult::Type::ARR, "labels", "Array of labels associated with the address. Currently limited to one label but returned\n"
                            "as an array to keep the API stable if multiple labels are enabled in the future.",
                        {
                            {RPCResult::Type::STR, "label name", "Label name (defaults to \"\")."},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getaddressinfo", "\"" + EXAMPLE_ADDRESS[0] + "\"") +
                    HelpExampleRpc("getaddressinfo", "\"" + EXAMPLE_ADDRESS[0] + "\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::string error_msg;
    CTxDestination dest = DecodeDestination(request.params[0].get_str(), error_msg);

    // Make sure the destination is valid
    if (!IsValidDestination(dest)) {
        // Set generic error message in case 'DecodeDestination' didn't set it
        if (error_msg.empty()) error_msg = "Invalid address";

        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error_msg);
    }

    UniValue ret(UniValue::VOBJ);

    std::string currentAddress = EncodeDestination(dest);
    ret.pushKV("address", currentAddress);

    CScript scriptPubKey = GetScriptForDestination(dest);
    ret.pushKV("scriptPubKey", HexStr(scriptPubKey));

    std::unique_ptr<SigningProvider> provider = pwallet->GetSolvingProvider(scriptPubKey);

    isminetype mine = pwallet->IsMine(dest);
    ret.pushKV("ismine", bool(mine & ISMINE_SPENDABLE));

    if (provider) {
        auto inferred = InferDescriptor(scriptPubKey, *provider);
        bool solvable = inferred->IsSolvable();
        ret.pushKV("solvable", solvable);
        if (solvable) {
            ret.pushKV("desc", inferred->ToString());
        }
    } else {
        ret.pushKV("solvable", false);
    }

    const auto& spk_mans = pwallet->GetScriptPubKeyMans(scriptPubKey);
    // In most cases there is only one matching ScriptPubKey manager and we can't resolve ambiguity in a better way
    ScriptPubKeyMan* spk_man{nullptr};
    if (spk_mans.size()) spk_man = *spk_mans.begin();

    DescriptorScriptPubKeyMan* desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
    if (desc_spk_man) {
        std::string desc_str;
        if (desc_spk_man->GetDescriptorString(desc_str, /*priv=*/false)) {
            ret.pushKV("parent_desc", desc_str);
        }
    }

    ret.pushKV("iswatchonly", bool(mine & ISMINE_WATCH_ONLY));

    UniValue detail = DescribeWalletAddress(*pwallet, dest);
    ret.pushKVs(std::move(detail));

    ret.pushKV("ischange", ScriptIsChange(*pwallet, scriptPubKey));

    if (spk_man) {
        if (const std::unique_ptr<CKeyMetadata> meta = spk_man->GetMetadata(dest)) {
            ret.pushKV("timestamp", meta->nCreateTime);
            if (meta->has_key_origin) {
                // In legacy wallets hdkeypath has always used an apostrophe for
                // hardened derivation. Perhaps some external tool depends on that.
                ret.pushKV("hdkeypath", WriteHDKeypath(meta->key_origin.path, /*apostrophe=*/!desc_spk_man));
                ret.pushKV("hdseedid", meta->hd_seed_id.GetHex());
                ret.pushKV("hdmasterfingerprint", HexStr(meta->key_origin.fingerprint));
            }
        }
    }

    // Return a `labels` array containing the label associated with the address,
    // equivalent to the `label` field above. Currently only one label can be
    // associated with an address, but we return an array so the API remains
    // stable if we allow multiple labels to be associated with an address in
    // the future.
    UniValue labels(UniValue::VARR);
    const auto* address_book_entry = pwallet->FindAddressBookEntry(dest);
    if (address_book_entry) {
        labels.push_back(address_book_entry->GetLabel());
    }
    ret.pushKV("labels", std::move(labels));

    return ret;
},
    };
}